

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void copy_texture_line(dbg_layer_t layer)

{
  ushort uVar1;
  byte bVar2;
  gba_ppu_t *pgVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  pgVar3 = ppu;
  if (layer == OBJ) {
    lVar4 = (ulong)ppu->y * 0x3c0;
    lVar6 = 0;
    do {
      bVar2 = (byte)pgVar3->objbuf[lVar6].raw;
      *(byte *)(lVar4 + 0x5dc1a1 + lVar6 * 4) = (bVar2 & 7) + bVar2 * '\b';
      bVar2 = (byte)(pgVar3->objbuf[lVar6].raw >> 5);
      *(byte *)(lVar4 + 0x5dc1a2 + lVar6 * 4) = (bVar2 & 7) + bVar2 * '\b';
      bVar2 = (byte)(pgVar3->objbuf[lVar6].raw >> 8);
      *(byte *)(lVar4 + 0x5dc1a3 + lVar6 * 4) = (bVar2 >> 2 & 7) + (bVar2 >> 2) * '\b';
      *(undefined1 *)(lVar4 + 0x5dc1a0 + lVar6 * 4) = 0xff;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xf0);
  }
  else {
    uVar5 = (ulong)layer;
    uVar1 = ppu->y;
    lVar4 = (ulong)uVar1 * 0x3c0 + uVar5 * 0x25800;
    lVar6 = 0;
    do {
      bVar2 = (byte)pgVar3->bgbuf[uVar5][lVar6].raw;
      *(byte *)(lVar4 + 0x5461a1 + lVar6 * 4) = (bVar2 & 7) + bVar2 * '\b';
      bVar2 = (byte)(pgVar3->bgbuf[uVar5][lVar6].raw >> 5);
      *(byte *)(lVar4 + 0x5461a2 + lVar6 * 4) = (bVar2 & 7) + bVar2 * '\b';
      bVar2 = (byte)(pgVar3->bgbuf[uVar5][lVar6].raw >> 8);
      *(byte *)(lVar4 + 0x5461a3 + lVar6 * 4) = (bVar2 >> 2 & 7) + (bVar2 >> 2) * '\b';
      dbg_bg_layers[uVar5][uVar1][lVar6].a = 0xff;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xf0);
  }
  return;
}

Assistant:

void copy_texture_line(dbg_layer_t layer) {
    if (layer == OBJ) {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            dbg_bg_layers[layer][ppu->y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->objbuf[x].r);
            dbg_bg_layers[layer][ppu->y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->objbuf[x].g);
            dbg_bg_layers[layer][ppu->y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->objbuf[x].b);
            dbg_bg_layers[layer][ppu->y][x].a = 0xFF;
        }
    } else {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            dbg_bg_layers[layer][ppu->y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->bgbuf[layer][x].r);
            dbg_bg_layers[layer][ppu->y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->bgbuf[layer][x].g);
            dbg_bg_layers[layer][ppu->y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->bgbuf[layer][x].b);
            dbg_bg_layers[layer][ppu->y][x].a = 0xFF;
        }
    }
}